

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

FindInfo __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::find_first_non_full
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *this,size_t hash)

{
  FindInfo FVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  int __c;
  int __c_00;
  char *pcVar5;
  long *in_RDI;
  BitMask<unsigned_int,_16,_0> mask;
  Group g;
  probe_seq<16UL> seq;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  size_t in_stack_ffffffffffffff98;
  probe_seq<16UL> *this_00;
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::function<unsigned_long_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_ffffffffffffffa0;
  long lVar6;
  uint local_4c;
  GroupSse2Impl local_48;
  probe_seq<16UL> local_38;
  size_t local_10;
  
  probe(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  while( true ) {
    lVar6 = *in_RDI;
    sVar4 = probe_seq<16UL>::offset(&local_38);
    pcVar5 = (char *)(lVar6 + sVar4);
    GroupSse2Impl::GroupSse2Impl(&local_48,pcVar5);
    local_4c = (uint)GroupSse2Impl::MatchEmptyOrDeleted
                               ((GroupSse2Impl *)
                                CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    bVar2 = BitMask::operator_cast_to_bool((BitMask *)&local_4c);
    if (bVar2) {
      iVar3 = BitMask<unsigned_int,_16,_0>::LowestBitSet((BitMask<unsigned_int,_16,_0> *)0x1ca8a8);
      pcVar5 = (char *)(long)iVar3;
      this_00 = &local_38;
      local_10 = probe_seq<16UL>::offset(this_00,(size_t)pcVar5);
      pcVar5 = probe_seq<16UL>::index(this_00,pcVar5,__c_00);
      FVar1.probe_length = (size_t)pcVar5;
      FVar1.offset = local_10;
      return FVar1;
    }
    pcVar5 = probe_seq<16UL>::index(&local_38,pcVar5,__c);
    in_stack_ffffffffffffff97 = pcVar5 < (char *)in_RDI[3];
    if (!(bool)in_stack_ffffffffffffff97) break;
    probe_seq<16UL>::next(&local_38);
  }
  __assert_fail("seq.index() < capacity_ && \"full table!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/parallel_hashmap/phmap.h"
                ,0x7be,
                "FindInfo phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::basic_string<char>, int>, std::function<unsigned long (const std::basic_string<char> &)>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, int>>>::find_first_non_full(size_t) [Policy = phmap::container_internal::FlatHashMapPolicy<std::basic_string<char>, int>, Hash = std::function<unsigned long (const std::basic_string<char> &)>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, int>>]"
               );
}

Assistant:

FindInfo find_first_non_full(size_t hash) {
        auto seq = probe(hash);
        while (true) {
            Group g{ctrl_ + seq.offset()};
            auto mask = g.MatchEmptyOrDeleted();
            if (mask) {
                return {seq.offset(mask.LowestBitSet()), seq.index()};
            }
            assert(seq.index() < capacity_ && "full table!");
            seq.next();
        }
    }